

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

Cofaces_simplex_range * __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::
cofaces_simplex_range
          (Cofaces_simplex_range *__return_storage_ptr__,
          Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *this,
          Simplex_handle *simplex,int codimension)

{
  stored_size_type *this_00;
  undefined1 auVar1 [12];
  unkbyte10 Var2;
  undefined4 codim;
  bool bVar3;
  int dim;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  SVar5;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  last;
  Fast_cofaces_predicate filter_pred;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_c88;
  undefined1 auStack_c80 [8];
  Fast_cofaces_predicate select;
  Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  local_998;
  undefined1 local_6c0 [8];
  Optimized_star_simplex_range range;
  undefined1 local_f8 [80];
  undefined1 local_a8 [8];
  Static_vertex_vector simp;
  undefined1 local_48 [8];
  Simplex_vertex_range rg;
  int codimension_local;
  Simplex_handle *simplex_local;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *this_local;
  ulong uVar4;
  
  rg.
  super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._12_4_ = codimension;
  if (codimension < 0) {
    __assert_fail("codimension >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                  ,0x59f,
                  "Cofaces_simplex_range Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::cofaces_simplex_range(const Simplex_handle, int) const [SimplexTreeOptions = Gudhi::Simplex_tree_options_custom_fil_values_full_featured]"
                 );
  }
  this_00 = &simp.
             super_vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>
             .m_holder.m_size;
  boost::container::dtl::
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  ::iterator_from_iiterator
            ((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
              *)this_00,simplex);
  simplex_vertex_range((Simplex_vertex_range *)local_48,this,(Simplex_handle *)this_00);
  SVar5 = boost::iterator_range_detail::
          iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
          ::begin((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
                   *)local_48);
  local_f8._48_8_ = SVar5.sib_;
  local_f8._56_2_ = SVar5.v_;
  local_f8._64_8_ = local_f8._48_8_;
  local_f8._72_2_ = local_f8._56_2_;
  SVar5 = boost::iterator_range_detail::
          iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
          ::end((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
                 *)local_48);
  local_f8._16_8_ = SVar5.sib_;
  local_f8._24_2_ = SVar5.v_;
  Var2 = SVar5._0_10_;
  auVar1._10_2_ = local_f8._42_2_;
  auVar1._0_10_ = Var2;
  SVar5.v_ = local_f8._72_2_;
  SVar5.sib_ = (Siblings *)local_f8._64_8_;
  SVar5._10_2_ = local_f8._74_2_;
  SVar5._12_4_ = 0;
  last._12_4_ = 0;
  last.sib_ = (Siblings *)(long)Var2;
  last.v_ = (short)((unkuint10)Var2 >> 0x40);
  last._10_2_ = local_f8._42_2_;
  uVar4 = (ulong)auVar1._8_4_;
  local_f8._32_8_ = local_f8._16_8_;
  local_f8._40_2_ = local_f8._24_2_;
  boost::container::static_vector<short,40ul,void>::
  static_vector<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>
            ((static_vector<short,40ul,void> *)local_a8,SVar5,last);
  boost::container::
  vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>::
  begin((vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>
         *)(local_f8 + 8));
  boost::container::
  vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>::end
            ((vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>
              *)local_f8);
  bVar3 = std::is_sorted<boost::container::vec_iterator<short*,false>,std::greater<short>>
                    ((vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>
                      *)(local_f8 + 8),
                     (vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>
                      *)local_f8);
  if (!bVar3) {
    __assert_fail("std::is_sorted(simp.begin(), simp.end(), std::greater<Vertex_handle>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                  ,0x5a5,
                  "Cofaces_simplex_range Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::cofaces_simplex_range(const Simplex_handle, int) const [SimplexTreeOptions = Gudhi::Simplex_tree_options_custom_fil_values_full_featured]"
                 );
  }
  Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  ::Simplex_tree_optimized_star_simplex_iterator(&local_998,this,(Static_vertex_vector *)local_a8);
  Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  ::Simplex_tree_optimized_star_simplex_iterator
            ((Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
              *)&select.codim_);
  boost::
  iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>
  ::
  iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>
            ((iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>
              *)local_6c0,&local_998,
             (Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
              *)&select.codim_);
  Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  ::~Simplex_tree_optimized_star_simplex_iterator
            ((Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
              *)&select.codim_);
  Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  ::~Simplex_tree_optimized_star_simplex_iterator(&local_998);
  codim = rg.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End._12_4_;
  boost::container::dtl::
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  ::iterator_from_iiterator(&local_c88,simplex);
  dim = dimension(this,&local_c88);
  Fast_cofaces_predicate::Fast_cofaces_predicate
            ((Fast_cofaces_predicate *)auStack_c80,this,codim,dim);
  filter_pred.codim_ = (int)uVar4;
  filter_pred.dim_ = (int)(uVar4 >> 0x20);
  filter_pred.st_ = select.st_;
  boost::adaptors::
  filter<boost::iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::Fast_cofaces_predicate>
            (__return_storage_ptr__,(adaptors *)local_6c0,
             (iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>
              *)auStack_c80,filter_pred);
  boost::
  iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>
  ::~iterator_range((iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>
                     *)local_6c0);
  boost::container::static_vector<short,_40UL,_void>::~static_vector
            ((static_vector<short,_40UL,_void> *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

Cofaces_simplex_range cofaces_simplex_range(const Simplex_handle simplex, int codimension) const{
    // codimension must be positive or null integer
    assert(codimension >= 0);

    if constexpr (Options::link_nodes_by_label) {
      Simplex_vertex_range rg = simplex_vertex_range(simplex);
      Static_vertex_vector simp(rg.begin(), rg.end());
      // must be sorted in decreasing order
      assert(std::is_sorted(simp.begin(), simp.end(), std::greater<Vertex_handle>()));
      auto range = Optimized_star_simplex_range(Optimized_star_simplex_iterator(this, std::move(simp)),
                                                Optimized_star_simplex_iterator());
      // Lazy filtered range
      Fast_cofaces_predicate select(this, codimension, this->dimension(simplex));
      return boost::adaptors::filter(range, select);
    } else {
      Cofaces_simplex_range cofaces;
      Simplex_vertex_range rg = simplex_vertex_range(simplex);
      std::vector<Vertex_handle> copy(rg.begin(), rg.end());
      if (codimension + static_cast<int>(copy.size()) > dimension_ + 1 ||
          (codimension == 0 && static_cast<int>(copy.size()) > dimension_))  // n+codimension greater than dimension_
        return cofaces;
      // must be sorted in decreasing order
      assert(std::is_sorted(copy.begin(), copy.end(), std::greater<Vertex_handle>()));
      bool star = codimension == 0;
      rec_coface(copy, &root_, 1, cofaces, star, codimension + static_cast<int>(copy.size()));
      return cofaces;
    }
  }